

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemInterface::handleExtendedKeyEvent
               (QWindow *window,ulong timestamp,Type type,int key,KeyboardModifiers modifiers,
               quint32 nativeScanCode,quint32 nativeVirtualKey,quint32 nativeModifiers,QString *text
               ,bool autorep,ushort count)

{
  Data *pDVar1;
  QString args_8;
  bool bVar2;
  long in_FS_OFFSET;
  bool in_stack_ffffffffffffffa0;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (text->d).d;
  local_40.ptr = (text->d).ptr;
  local_40.size = (text->d).size;
  if (pDVar1 == (Data *)0x0) {
    local_40.d = (Data *)0x0;
  }
  else {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_40.d = pDVar1;
  }
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  args_8.d.ptr._0_1_ = autorep;
  args_8.d.d = (Data *)&local_40;
  args_8.d.ptr._1_7_ = 0;
  args_8.d.size._0_2_ = count;
  args_8.d.size._2_6_ = 0;
  bVar2 = QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
          handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
                    (window,timestamp,type,key,
                     (QFlags<Qt::KeyboardModifier>)
                     modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                     super_QFlagsStorage<Qt::KeyboardModifier>.i,nativeScanCode,nativeVirtualKey,
                     nativeModifiers,args_8,in_stack_ffffffffffffffa0,(unsigned_short)pDVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemInterface::handleExtendedKeyEvent(QWindow *window, ulong timestamp, QEvent::Type type, int key,
                                                    Qt::KeyboardModifiers modifiers,
                                                    quint32 nativeScanCode, quint32 nativeVirtualKey,
                                                    quint32 nativeModifiers,
                                                    const QString& text, bool autorep,
                                                    ushort count)
{
    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::KeyEvent>(window,
        timestamp, type, key, modifiers, nativeScanCode, nativeVirtualKey, nativeModifiers, text, autorep, count);
}